

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O3

sexp_conflict
sexp_scheduler(sexp_conflict ctx,sexp_conflict self,sexp_sint_t n,sexp_conflict root_thread)

{
  sexp_conflict *ppsVar1;
  anon_union_24768_35_b8e82fc1_for_value *paVar2;
  int iVar3;
  int iVar4;
  sexp psVar5;
  sexp_conflict psVar6;
  sexp_conflict psVar7;
  sexp psVar8;
  long lVar9;
  sexp_conflict psVar10;
  long lVar11;
  sexp_conflict psVar12;
  sexp_mark_stack_ptr_t **ppsVar13;
  sexp_conflict **pppsVar14;
  sexp_conflict psVar15;
  long lVar16;
  sexp_sint_t n_00;
  sexp_conflict *ppsVar17;
  __useconds_t __useconds;
  sexp psVar18;
  sexp_conflict psVar19;
  long lVar20;
  sexp_conflict psVar21;
  undefined1 auVar22 [16];
  sexp_conflict tmp;
  timeval tval;
  sexp_conflict local_78;
  sexp_conflict local_70;
  sexp_conflict local_68;
  timeval local_60;
  sexp local_50;
  sexp_conflict *local_48;
  sexp_gc_var_t local_40;
  
  local_40.var = &local_78;
  local_78 = (sexp_conflict)0x43e;
  local_40.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_40;
  psVar8 = (ctx->value).type.setters;
  psVar19 = (sexp_conflict)(psVar8->value).context.mark_stack[9].prev;
  psVar10 = (sexp_conflict)(psVar8->value).context.mark_stack[10].end;
  ppsVar17 = &local_78;
  if (((psVar8->value).context.mark_stack[10].prev != (sexp_mark_stack_ptr_t *)0x1) &&
     (psVar12 = (sexp_conflict)(psVar8->value).context.mark_stack[0xb].start, ppsVar17 = &local_78,
     ((ulong)psVar12 & 3) == 0)) {
    if (psVar12->tag == 0x24) {
      ppsVar17 = &local_78;
      if ((psVar12->value).flonum_bits[0x60a3] != '\0') {
        (psVar12->value).flonum_bits[0x60a3] = '\0';
        sexp_thread_start(ctx,self,n,psVar12);
        ppsVar17 = local_40.var;
      }
    }
    else {
      ppsVar17 = &local_78;
      if (psVar12->tag == 0x17) {
        local_40.var = &local_78;
        local_78 = (sexp_conflict)sexp_intern(ctx,"signal-runner",0xffffffffffffffff);
        auVar22 = sexp_env_cell(ctx,psVar12,local_78,0);
        local_78 = auVar22._0_8_;
        ppsVar17 = local_40.var;
        if (((((auVar22 & (undefined1  [16])0x3) == (undefined1  [16])0x0) && (local_78->tag == 6))
            && (psVar12 = (local_78->value).type.cpl, ((ulong)psVar12 & 3) == 0)) &&
           (psVar12->tag == 0x14)) {
          psVar12 = sexp_make_thread(ctx,self,auVar22._8_8_,psVar12,(sexp_conflict)&DAT_0000003e);
          (((ctx->value).type.setters)->value).context.mark_stack[0xb].start =
               (sexp_conflict *)psVar12;
          sexp_thread_start(ctx,self,n_00,psVar12);
          ppsVar17 = local_40.var;
          if ((((ulong)psVar19 & 3) != 0) || (psVar19->tag != 6)) {
            psVar19 = (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[9].prev
            ;
          }
        }
      }
    }
  }
  local_40.var = ppsVar17;
  psVar8 = (ctx->value).type.setters;
  ppsVar17 = (psVar8->value).context.mark_stack[0xb].end;
  if (((((ulong)ppsVar17 & 3) == 0) &&
      ((long)(psVar8->value).context.mark_stack[0xc].prev >> 1 == (ulong)*(uint *)ppsVar17)) &&
     (ppsVar17[2] != (sexp_conflict)0x0)) {
    local_70 = ppsVar17[1];
    iVar3 = poll((pollfd *)local_70,(nfds_t)ppsVar17[2],0);
    if (0 < iVar3 && -1 < (int)(*(uint *)(ppsVar17 + 2) - 1)) {
      psVar15 = (sexp_conflict)(ulong)(*(uint *)(ppsVar17 + 2) - 1);
      psVar12 = local_70;
      local_50 = ctx;
      local_48 = ppsVar17;
      do {
        if (0 < *(short *)((long)&psVar12->field_0x6 + (long)psVar15 * 4 * 2)) {
          psVar8 = (ctx->value).opcode.dl;
          if ((((ulong)psVar8 & 3) == 0) && ((psVar8->tag & 0xfffffffe) == 0x10)) {
            psVar18 = (psVar8->value).type.getters;
            if (psVar18 == (sexp)0x0) {
              psVar18 = (psVar8->value).type.slots;
              psVar5 = (sexp)0xffffffffffffffff;
              if ((((ulong)psVar18 & 3) == 0) && (psVar18->tag == 0x12)) {
                psVar5 = (psVar18->value).type.cpl;
              }
            }
            else {
              local_68 = (sexp_conflict)CONCAT44(local_68._4_4_,iVar3);
              iVar3 = fileno((FILE *)psVar18);
              psVar5 = (sexp)(long)iVar3;
              psVar12 = local_70;
              iVar3 = (int)local_68;
            }
            if (psVar5 != (sexp)(long)(int)(&psVar12->tag)[(long)psVar15 * 2]) goto LAB_00102fe1;
LAB_00102ff3:
            *(undefined2 *)((long)&ctx->value + 0x60a2) = 0;
            (ctx->value).opcode.dl = (sexp)0x3e;
          }
          else {
LAB_00102fe1:
            if ((((ulong)psVar8 & 1) != 0) &&
               ((long)psVar8 >> 1 == (long)(int)(&psVar12->tag)[(long)psVar15 * 2]))
            goto LAB_00102ff3;
          }
          if (((ulong)psVar10 & 3) == 0) {
            psVar21 = (sexp_conflict)&DAT_0000023e;
            psVar7 = psVar10;
            do {
              if (psVar7->tag != 6) break;
              psVar8 = (((psVar7->value).type.name)->value).opcode.dl;
              if ((((ulong)psVar8 & 3) == 0) && ((psVar8->tag & 0xfffffffe) == 0x10)) {
                psVar18 = (psVar8->value).type.getters;
                if (psVar18 == (sexp)0x0) {
                  psVar18 = (psVar8->value).type.slots;
                  psVar5 = (sexp)0xffffffffffffffff;
                  if ((((ulong)psVar18 & 3) == 0) && (psVar18->tag == 0x12)) {
                    psVar5 = (psVar18->value).type.cpl;
                  }
                }
                else {
                  local_68 = psVar21;
                  iVar4 = fileno((FILE *)psVar18);
                  psVar5 = (sexp)(long)iVar4;
                  ctx = local_50;
                  ppsVar17 = local_48;
                  psVar12 = local_70;
                  psVar21 = local_68;
                }
                if (psVar5 != (sexp)(long)(int)(&psVar12->tag)[(long)psVar15 * 2])
                goto LAB_0010309d;
LAB_001030af:
                (((psVar7->value).type.name)->value).flonum_bits[0x60a3] = '\0';
                (((psVar7->value).type.name)->value).flonum_bits[0x60a2] = '\0';
                (((psVar7->value).type.name)->value).opcode.dl = (sexp)0x3e;
                psVar6 = (sexp_conflict)(psVar7->value).string.offset;
                if (psVar21 == (sexp_conflict)&DAT_0000023e) {
                  paVar2 = (anon_union_24768_35_b8e82fc1_for_value *)
                           ((((ctx->value).type.setters)->value).context.mark_stack + 10);
                  psVar10 = psVar6;
                }
                else {
                  paVar2 = &psVar21->value;
                }
                (paVar2->type).cpl = psVar6;
                (psVar7->value).string.offset = 0x23e;
                local_78 = psVar6;
                if ((psVar7->value).type.name != ctx) {
                  psVar8 = (ctx->value).type.setters;
                  ppsVar1 = (psVar8->value).context.mark_stack[10].start;
                  if ((((ulong)ppsVar1 & 3) == 0) && (*(int *)ppsVar1 == 6)) {
                    ppsVar13 = (sexp_mark_stack_ptr_t **)(ppsVar1 + 2);
                  }
                  else {
                    ppsVar13 = &(psVar8->value).context.mark_stack[9].prev;
                    psVar19 = psVar7;
                  }
                  *ppsVar13 = (sexp_mark_stack_ptr_t *)psVar7;
                  (((ctx->value).type.setters)->value).context.mark_stack[10].start =
                       (sexp_conflict *)psVar7;
                }
              }
              else {
LAB_0010309d:
                if ((((ulong)psVar8 & 1) != 0) &&
                   ((long)psVar8 >> 1 == (long)(int)(&psVar12->tag)[(long)psVar15 * 2]))
                goto LAB_001030af;
                psVar6 = (psVar7->value).type.cpl;
                psVar21 = psVar7;
              }
              psVar7 = psVar6;
            } while (((ulong)psVar6 & 3) == 0);
          }
          psVar7 = (sexp_conflict)((long)&ppsVar17[2][-1].value + 0x60bf);
          if (psVar15 < psVar7) {
            *(undefined8 *)(&psVar12->tag + (long)psVar15 * 2) =
                 *(undefined8 *)
                  ((long)&psVar12[7].value + (long)&ppsVar17[2][-1].value * 8 + 0x6078);
            psVar7 = (sexp_conflict)((long)&ppsVar17[2][-1].value + 0x60bf);
          }
          iVar3 = iVar3 + -1;
          ppsVar17[2] = psVar7;
        }
      } while ((0 < (long)psVar15) &&
              (psVar15 = (sexp_conflict)((long)&psVar15[-1].value.flonum + 0x60bf), 0 < iVar3));
    }
  }
  psVar12 = psVar10;
  if (((ctx->value).context.refuel < 1) && (((ulong)psVar10 & 3) == 0)) {
    psVar15 = (sexp_conflict)&DAT_0000023e;
    do {
      if (psVar10->tag != 6) break;
      psVar8 = (psVar10->value).type.name;
      if ((psVar8->value).opcode.dl == ctx) {
        (psVar8->value).flonum_bits[0x60a3] = '\0';
        (((psVar10->value).type.name)->value).flonum_bits[0x60a2] = '\0';
        local_78 = (sexp_conflict)(psVar10->value).string.offset;
        if (psVar15 == (sexp_conflict)&DAT_0000023e) {
          paVar2 = (anon_union_24768_35_b8e82fc1_for_value *)
                   ((((ctx->value).type.setters)->value).context.mark_stack + 10);
          psVar12 = local_78;
        }
        else {
          paVar2 = &psVar15->value;
        }
        (paVar2->string).offset = (sexp_uint_t)local_78;
        (psVar10->value).string.offset = 0x23e;
        psVar8 = (ctx->value).type.setters;
        ppsVar17 = (psVar8->value).context.mark_stack[10].start;
        if ((((ulong)ppsVar17 & 3) == 0) && (*(int *)ppsVar17 == 6)) {
          ppsVar13 = (sexp_mark_stack_ptr_t **)(ppsVar17 + 2);
        }
        else {
          ppsVar13 = &(psVar8->value).context.mark_stack[9].prev;
          psVar19 = psVar10;
        }
        *ppsVar13 = (sexp_mark_stack_ptr_t *)psVar10;
        (((ctx->value).type.setters)->value).context.mark_stack[10].start = (sexp_conflict *)psVar10
        ;
        psVar10 = local_78;
      }
      else {
        psVar15 = psVar10;
        psVar10 = (psVar10->value).type.cpl;
      }
    } while (((ulong)psVar10 & 3) == 0);
  }
  if (((((ulong)psVar12 & 3) == 0) && (psVar12->tag == 6)) &&
     (iVar3 = gettimeofday(&local_60,(__timezone_ptr_t)0x0), iVar3 == 0)) {
    psVar10 = (sexp_conflict)&DAT_0000023e;
    psVar8 = psVar12;
    psVar18 = psVar12;
    if (psVar12->tag == 6) {
      while( true ) {
        psVar5 = (psVar18->value).type.name;
        lVar9 = (psVar5->value).context.tval.tv_sec;
        psVar8 = psVar18;
        if (((lVar9 == 0) && ((psVar5->value).context.tval.tv_usec == 0)) ||
           ((local_60.tv_sec <= lVar9 &&
            ((lVar9 != local_60.tv_sec || (local_60.tv_usec <= (psVar5->value).context.tval.tv_usec)
             ))))) break;
        (psVar5->value).flonum_bits[0x60a2] = '\x01';
        (((psVar18->value).type.name)->value).flonum_bits[0x60a3] = '\0';
        psVar8 = (psVar18->value).type.cpl;
        psVar10 = psVar18;
        if ((((ulong)psVar8 & 3) != 0) || (psVar18 = psVar8, psVar8->tag != 6)) break;
      }
    }
    if ((((ulong)psVar10 & 2) == 0) && (psVar10->tag == 6)) {
      (psVar10->value).string.offset = 0x23e;
      psVar18 = (ctx->value).type.setters;
      ppsVar17 = (psVar18->value).context.mark_stack[10].start;
      if ((((ulong)ppsVar17 & 3) == 0) && (*(int *)ppsVar17 == 6)) {
        ppsVar13 = (sexp_mark_stack_ptr_t **)(ppsVar17 + 2);
      }
      else {
        ppsVar13 = &(psVar18->value).context.mark_stack[9].prev;
        psVar19 = psVar12;
      }
      *ppsVar13 = (sexp_mark_stack_ptr_t *)psVar12;
      (((ctx->value).type.setters)->value).context.mark_stack[10].start = (sexp_conflict *)psVar10;
      (((ctx->value).type.setters)->value).context.mark_stack[10].end = (sexp_conflict *)psVar8;
      psVar12 = psVar8;
    }
  }
  if (((ulong)psVar19 & 3) == 0) {
    lVar9 = (ctx->value).context.refuel;
    if (psVar19->tag != 6) goto LAB_001033c0;
    psVar10 = (psVar19->value).type.name;
    if (lVar9 < 1) {
      psVar8 = (ctx->value).type.setters;
LAB_00103521:
      psVar18 = (psVar19->value).type.cpl;
      (psVar8->value).context.mark_stack[9].prev = (sexp_mark_stack_ptr_t *)psVar18;
      if ((((ulong)psVar18 & 3) != 0) || (psVar18->tag != 6)) {
        (((ctx->value).type.setters)->value).context.mark_stack[10].start = (sexp_conflict *)0x23e;
      }
      if ((0 < (ctx->value).context.refuel) && (lVar9 = sexp_memq_op(ctx,0,2,ctx), lVar9 == 0x3e)) {
        sexp_insert_timed(ctx,ctx,(sexp_conflict)&DAT_0000003e);
      }
      psVar12 = (sexp_conflict)(((ctx->value).type.setters)->value).context.mark_stack[10].end;
    }
    else {
      psVar8 = (ctx->value).type.setters;
      if ((ctx->value).flonum_bits[0x60a3] != '\0') goto LAB_00103521;
      ((psVar8->value).context.mark_stack[9].prev)->end = (sexp_conflict *)ctx;
      psVar8 = (ctx->value).type.setters;
      (psVar8->value).context.mark_stack[10].start[2] =
           (sexp_conflict)(psVar8->value).context.mark_stack[9].prev;
      psVar8 = (ctx->value).type.setters;
      (psVar8->value).context.mark_stack[9].prev =
           ((psVar8->value).context.mark_stack[9].prev)->prev;
      psVar8 = (ctx->value).type.setters;
      (psVar8->value).context.mark_stack[10].start =
           (sexp_conflict *)(psVar8->value).context.mark_stack[10].start[2];
      (((ctx->value).type.setters)->value).context.mark_stack[10].start[2] = (sexp_conflict)0x23e;
    }
  }
  else {
    lVar9 = (ctx->value).context.refuel;
LAB_001033c0:
    psVar10 = ctx;
    if ((lVar9 < 1) && (psVar8 = psVar12, ((ulong)psVar12 & 3) == 0)) {
      while (psVar10 = ctx, psVar8->tag == 6) {
        psVar10 = (psVar8->value).type.name;
        psVar18 = (psVar10->value).opcode.dl;
        if ((((ulong)psVar18 & 1) != 0) ||
           (((((ulong)psVar18 & 2) == 0 && ((psVar18->tag & 0xfffffffe) == 0x10)) ||
            (psVar8 = (psVar8->value).type.cpl, psVar10 = ctx, ((ulong)psVar8 & 3) != 0)))) break;
      }
    }
  }
  if ((psVar10->value).flonum_bits[0x60a3] == '\0') goto LAB_0010362e;
  if ((((ulong)psVar12 & 3) == 0) && (psVar12->tag == 6)) {
    psVar19 = (psVar12->value).type.name;
    lVar9 = (psVar19->value).context.tval.tv_sec;
    if (((lVar9 == 0) && ((psVar19->value).context.tval.tv_usec == 0)) ||
       ((lVar20 = (psVar10->value).context.tval.tv_sec, lVar20 <= lVar9 &&
        ((lVar9 != lVar20 ||
         ((psVar10->value).context.tval.tv_usec <= (psVar19->value).context.tval.tv_usec))))))
    goto LAB_0010359d;
    (((ctx->value).type.setters)->value).context.mark_stack[10].end =
         (sexp_conflict *)(psVar12->value).type.cpl;
    local_78 = psVar10;
    lVar9 = sexp_memq_op(ctx,0,2,psVar10);
    psVar10 = psVar19;
    if (lVar9 == 0x3e) {
      sexp_insert_timed(ctx,local_78,local_78);
    }
  }
  else {
LAB_0010359d:
    psVar8 = (ctx->value).type.setters;
    psVar19 = (sexp_conflict)(psVar8->value).context.mark_stack[10].end;
    if (((ulong)psVar19 & 3) == 0) {
      psVar12 = (sexp_conflict)(sexp_conflict *)0x0;
      do {
        psVar15 = psVar19;
        if (psVar15->tag != 6) break;
        if (*(sexp_conflict *)&psVar15->value == psVar10) {
          pppsVar14 = (sexp_conflict **)((long)psVar12 + 0x10);
          if (psVar12 == (sexp_conflict)0x0) {
            pppsVar14 = &(psVar8->value).context.mark_stack[10].end;
          }
          *pppsVar14 = (sexp_conflict *)*(sexp_conflict *)((long)&psVar15->value + 8);
          break;
        }
        psVar19 = *(sexp_conflict *)((long)&psVar15->value + 8);
        psVar12 = psVar15;
      } while (((ulong)psVar19 & 3) == 0);
    }
  }
  if (((psVar10->value).context.tval.tv_sec == 0) && ((psVar10->value).context.tval.tv_usec == 0)) {
    __useconds = 10000;
  }
  else {
    lVar20 = 0;
    gettimeofday(&local_60,(__timezone_ptr_t)0x0);
    lVar9 = (psVar10->value).context.tval.tv_sec;
    lVar11 = lVar9 - local_60.tv_sec;
    if (local_60.tv_sec <= lVar9) {
      lVar9 = (psVar10->value).context.tval.tv_usec;
      lVar16 = lVar9 - local_60.tv_usec;
      lVar20 = 0;
      if (lVar16 != 0 && local_60.tv_usec <= lVar9) {
        lVar20 = lVar16;
      }
      if (0 < lVar11) {
        lVar20 = lVar16;
      }
      lVar20 = lVar20 + lVar11 * 1000000;
      __useconds = 10000;
      if (10000 < lVar20) goto LAB_00103629;
    }
    *(undefined2 *)((long)&psVar10->value + 0x60a2) = 1;
    __useconds = (__useconds_t)lVar20;
  }
LAB_00103629:
  usleep(__useconds);
LAB_0010362e:
  (ctx->value).context.saves = local_40.next;
  return psVar10;
}

Assistant:

sexp sexp_scheduler (sexp ctx, sexp self, sexp_sint_t n, sexp root_thread) {
  int i, k;
  struct timeval tval;
  struct pollfd *pfds;
  suseconds_t usecs = 0;
  sexp res, ls1, ls2, evt, runner, paused, front, pollfds;
  sexp_gc_var1(tmp);
  sexp_gc_preserve1(ctx, tmp);

  front  = sexp_global(ctx, SEXP_G_THREADS_FRONT);
  paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);

  /* check signals */
  if (sexp_global(ctx, SEXP_G_THREADS_SIGNALS) != SEXP_ZERO) {
    runner = sexp_global(ctx, SEXP_G_THREADS_SIGNAL_RUNNER);
    if (! sexp_contextp(runner)) { /* ensure the runner exists */
      if (sexp_envp(runner)) {
        tmp = sexp_env_cell(ctx, runner, (tmp=sexp_intern(ctx, "signal-runner", -1)), 0);
        if (sexp_pairp(tmp) && sexp_procedurep(sexp_cdr(tmp))) {
          runner = sexp_make_thread(ctx, self, 2, sexp_cdr(tmp), SEXP_FALSE);
          sexp_global(ctx, SEXP_G_THREADS_SIGNAL_RUNNER) = runner;
          sexp_thread_start(ctx, self, 1, runner);
          if (!sexp_pairp(front))
            front = sexp_global(ctx, SEXP_G_THREADS_FRONT);
        }
      }
    } else if (sexp_context_waitp(runner)) { /* wake it if it's sleeping */
      sexp_context_waitp(runner) = 0;
      sexp_thread_start(ctx, self, 1, runner);
    }
  }

  /* check blocked fds */
  pollfds = sexp_global(ctx, SEXP_G_THREADS_POLL_FDS);
  if (sexp_pollfdsp(ctx, pollfds) && sexp_pollfds_num_fds(pollfds) > 0) {
    pfds = sexp_pollfds_fds(pollfds);
    k = poll(sexp_pollfds_fds(pollfds), sexp_pollfds_num_fds(pollfds), 0);
    for (i=sexp_pollfds_num_fds(pollfds)-1; i>=0 && k>0; --i) {
      if (pfds[i].revents > 0) { /* free all threads blocked on this fd */
        k--;
        /* maybe unblock the current thread */
        evt = sexp_context_event(ctx);
        if ((sexp_portp(evt) && (sexp_port_fileno(evt) == pfds[i].fd))
            || (sexp_fixnump(evt) && (sexp_unbox_fixnum(evt) == pfds[i].fd))) {
          sexp_context_waitp(ctx) = 0;
          sexp_context_timeoutp(ctx) = 0;
          sexp_context_event(ctx) = SEXP_FALSE;
        }
        /* maybe unblock paused threads */
        for (ls1=SEXP_NULL, ls2=paused; sexp_pairp(ls2); ) {
          /* TODO: distinguish input and output on the same fd? */
          evt = sexp_context_event(sexp_car(ls2));
          if ((sexp_portp(evt) && sexp_port_fileno(evt) == pfds[i].fd)
              || (sexp_fixnump(evt) && sexp_unbox_fixnum(evt) == pfds[i].fd)) {
            sexp_context_waitp(sexp_car(ls2)) = 0;
            sexp_context_timeoutp(sexp_car(ls2)) = 0;
            sexp_context_event(sexp_car(ls2)) = SEXP_FALSE;
            if (ls1==SEXP_NULL)
              sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = sexp_cdr(ls2);
            else
              sexp_cdr(ls1) = sexp_cdr(ls2);
            tmp = sexp_cdr(ls2);
            sexp_cdr(ls2) = SEXP_NULL;
            if (sexp_car(ls2) != ctx) {
              if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
                sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = ls2;
              } else {
                sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = ls2;
              }
              sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
            }
            ls2 = tmp;
          } else {
            ls1 = ls2;
            ls2 = sexp_cdr(ls2);
          }
        }
        if (i < (sexp_pollfds_num_fds(pollfds) - 1)) {
          pfds[i] = pfds[sexp_pollfds_num_fds(pollfds) - 1];
        }
        sexp_pollfds_num_fds(pollfds) -= 1;
      }
    }
  }

  /* if we've terminated, check threads joining us */
  if (sexp_context_refuel(ctx) <= 0) {
    for (ls1=SEXP_NULL, ls2=paused; sexp_pairp(ls2); ) {
      if (sexp_context_event(sexp_car(ls2)) == ctx) {
        sexp_context_waitp(sexp_car(ls2)) = 0;
        sexp_context_timeoutp(sexp_car(ls2)) = 0;
        if (ls1==SEXP_NULL)
          sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = sexp_cdr(ls2);
        else
          sexp_cdr(ls1) = sexp_cdr(ls2);
        tmp = sexp_cdr(ls2);
        sexp_cdr(ls2) = SEXP_NULL;
        if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
          sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = ls2;
        } else {
          sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = ls2;
        }
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls2;
        ls2 = tmp;
      } else {
        ls1 = ls2;
        ls2 = sexp_cdr(ls2);
      }
    }
  }

  /* check timeouts */
  if (sexp_pairp(paused)) {
    if (gettimeofday(&tval, NULL) == 0) {
      ls1 = SEXP_NULL;
      ls2 = paused;
      while (sexp_pairp(ls2) && sexp_context_before(sexp_car(ls2), tval)) {
        sexp_context_timeoutp(sexp_car(ls2)) = 1;
        sexp_context_waitp(sexp_car(ls2)) = 0;
        ls1 = ls2;
        ls2 = sexp_cdr(ls2);
      }
      if (sexp_pairp(ls1)) {
        sexp_cdr(ls1) = SEXP_NULL;
        if (! sexp_pairp(sexp_global(ctx, SEXP_G_THREADS_BACK))) {
          sexp_global(ctx, SEXP_G_THREADS_FRONT) = front = paused;
        } else {
          sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = paused;
        }
        sexp_global(ctx, SEXP_G_THREADS_BACK) = ls1;
        sexp_global(ctx, SEXP_G_THREADS_PAUSED) = paused = ls2;
      }
    }
  }

  /* dequeue next thread */
  if (sexp_pairp(front)) {
    res = sexp_car(front);
    if ((sexp_context_refuel(ctx) <= 0) || sexp_context_waitp(ctx)) {
      /* orig ctx is either terminated or paused */
      sexp_global(ctx, SEXP_G_THREADS_FRONT) = sexp_cdr(front);
      if (! sexp_pairp(sexp_cdr(front)))
        sexp_global(ctx, SEXP_G_THREADS_BACK) = SEXP_NULL;
      if (sexp_context_refuel(ctx) > 0 && sexp_not(sexp_memq(ctx, ctx, paused)))
        sexp_insert_timed(ctx, ctx, SEXP_FALSE);
      paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
    } else {
      /* swap with front of queue */
      sexp_car(sexp_global(ctx, SEXP_G_THREADS_FRONT)) = ctx;
      /* rotate front of queue to back */
      sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK))
        = sexp_global(ctx, SEXP_G_THREADS_FRONT);
      sexp_global(ctx, SEXP_G_THREADS_FRONT)
        = sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_FRONT));
      sexp_global(ctx, SEXP_G_THREADS_BACK)
        = sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK));
      sexp_cdr(sexp_global(ctx, SEXP_G_THREADS_BACK)) = SEXP_NULL;
    }
  } else {
    /* no threads to dequeue */
    res = ctx;
    /* prefer a thread we can wait on instead of spinning */
    if (sexp_context_refuel(ctx) <= 0) {
      for (ls1=paused; sexp_pairp(ls1); ls1=sexp_cdr(ls1)) {
        evt = sexp_context_event(sexp_car(ls1));
        if (sexp_fixnump(evt) || sexp_portp(evt)) {
          res = sexp_car(ls1);
          break;
        }
      }
    }
  }

  if (sexp_context_waitp(res)) {
    /* the only thread available was waiting */
    /* TODO: if another thread is blocked on I/O, wait on that with
     * the appropriate minimum timeout */
    if (sexp_pairp(paused)
        && sexp_context_before(sexp_car(paused), sexp_context_timeval(res))) {
      tmp = res;
      res = sexp_car(paused);
      paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED) = sexp_cdr(paused);
      if (sexp_not(sexp_memq(ctx, tmp, paused)))
        sexp_insert_timed(ctx, tmp, tmp);
    } else {
      sexp_delete_list(ctx, SEXP_G_THREADS_PAUSED, res);
    }
    paused = sexp_global(ctx, SEXP_G_THREADS_PAUSED);
    usecs = 0;
    if ((sexp_context_timeval(res).tv_sec == 0)
        && (sexp_context_timeval(res).tv_usec == 0)) {
      /* no timeout, wait for default 10ms */
      usecs = 10*1000;
    } else {
      /* wait until the next timeout, or at most 10ms */
      gettimeofday(&tval, NULL);
      if (tval.tv_sec <= sexp_context_timeval(res).tv_sec) {
        usecs = (sexp_context_timeval(res).tv_sec - tval.tv_sec) * 1000000;
        if (tval.tv_usec < sexp_context_timeval(res).tv_usec || usecs > 0)
          usecs += sexp_context_timeval(res).tv_usec - tval.tv_usec;
      }
      if (usecs > 10*1000) {
        usecs = 10*1000;
      } else {
        sexp_context_waitp(res) = 0;
        sexp_context_timeoutp(res) = 1;
      }
    }
    /* take a nap to avoid busy looping */
    usleep(usecs);
  }

  sexp_gc_release1(ctx);
  return res;
}